

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.h
# Opt level: O3

SnapshotImpl * __thiscall
leveldb::SnapshotList::New(SnapshotList *this,SequenceNumber sequence_number)

{
  long lVar1;
  SnapshotImpl *pSVar2;
  SnapshotImpl *pSVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar2 = (this->head_).prev_;
  if (((this->head_).next_ != &this->head_) && (sequence_number < pSVar2->sequence_number_)) {
    __assert_fail("empty() || newest()->sequence_number_ <= sequence_number",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/snapshot.h"
                  ,0x3a,"SnapshotImpl *leveldb::SnapshotList::New(SequenceNumber)");
  }
  pSVar3 = (SnapshotImpl *)operator_new(0x28);
  (pSVar3->super_Snapshot)._vptr_Snapshot = (_func_int **)&PTR__Snapshot_013bc428;
  pSVar3->sequence_number_ = sequence_number;
  pSVar3->list_ = this;
  pSVar3->next_ = &this->head_;
  pSVar3->prev_ = pSVar2;
  pSVar2->next_ = pSVar3;
  (this->head_).prev_ = pSVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pSVar3;
  }
  __stack_chk_fail();
}

Assistant:

SnapshotImpl* New(SequenceNumber sequence_number) {
    assert(empty() || newest()->sequence_number_ <= sequence_number);

    SnapshotImpl* snapshot = new SnapshotImpl(sequence_number);

#if !defined(NDEBUG)
    snapshot->list_ = this;
#endif  // !defined(NDEBUG)
    snapshot->next_ = &head_;
    snapshot->prev_ = head_.prev_;
    snapshot->prev_->next_ = snapshot;
    snapshot->next_->prev_ = snapshot;
    return snapshot;
  }